

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool IsValidSubDVertex(ON_SubDVertex *vertex,unsigned_short level,uint *vertex_id_range,
                      unsigned_short ordinary_valence_count,bool bSilentError)

{
  ON_SubDEdgePtr *pOVar1;
  ON_SubDFace **ppOVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ON_Internal_DamagedMarker dm;
  ON_Internal_DamagedMarker local_10;
  
  bVar7 = SUB21(ordinary_valence_count,0);
  if (((vertex == (ON_SubDVertex *)0x0) || ((vertex->super_ON_SubDComponentBase).m_level != level))
     || ((vertex_id_range != (uint *)0x0 &&
         ((uVar5 = (vertex->super_ON_SubDComponentBase).m_id, uVar5 < *vertex_id_range ||
          (vertex_id_range[1] < uVar5)))))) {
    bVar7 = ON_SubDIsNotValid(bVar7);
    return bVar7;
  }
  uVar3 = vertex->m_edge_count;
  uVar8 = (ulong)uVar3;
  uVar4 = vertex->m_face_count;
  local_10.m_subd_component = &vertex->super_ON_SubDComponentBase;
  if (uVar3 < uVar4) {
    if ((2 < uVar3) && (vertex->m_vertex_tag == Corner)) {
LAB_005d61fa:
      if (vertex->m_edges != (ON_SubDEdgePtr *)0x0) {
        bVar6 = false;
        goto LAB_005d6209;
      }
    }
  }
  else {
    if (uVar8 != 0) goto LAB_005d61fa;
    bVar6 = true;
LAB_005d6209:
    if (((ulong)uVar4 == 0) || (vertex->m_faces != (ON_SubDFace **)0x0)) {
      switch(vertex->m_vertex_tag) {
      case Smooth:
        if (uVar3 == uVar4) {
LAB_005d627a:
          uVar9 = 0;
          do {
            if (uVar8 == uVar9) {
              uVar8 = 0;
              goto LAB_005d629c;
            }
            pOVar1 = vertex->m_edges + uVar9;
            uVar9 = uVar9 + 1;
          } while (7 < pOVar1->m_ptr);
          bVar7 = ON_SubDIsNotValid(bVar7);
          goto LAB_005d624a;
        }
        break;
      case Crease:
        if (1 < uVar3) goto LAB_005d627a;
        break;
      case Corner:
        if (!bVar6) goto LAB_005d627a;
        break;
      case Dart:
        if ((uVar8 == 4 || level == 0) && uVar3 == uVar4) goto LAB_005d627a;
      }
    }
  }
  bVar7 = ON_SubDIsNotValid(bVar7);
LAB_005d624a:
  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker(&local_10);
  return bVar7;
  while (ppOVar2 = vertex->m_faces + uVar8, uVar8 = uVar8 + 1, *ppOVar2 != (ON_SubDFace *)0x0) {
LAB_005d629c:
    if (uVar4 == uVar8) {
      local_10.m_subd_component = (ON_SubDComponentBase *)0x0;
      bVar7 = true;
      goto LAB_005d624a;
    }
  }
  bVar7 = ON_SubDIsNotValid(bVar7);
  goto LAB_005d624a;
}

Assistant:

static bool IsValidSubDVertex(
  const ON_SubDVertex* vertex,
  unsigned short level,
  unsigned int* vertex_id_range,
  unsigned short ordinary_valence_count,
  bool bSilentError
  )
{
  if (nullptr == vertex)
    return ON_SubDIsNotValid(bSilentError);
  
  if (vertex->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);
  
  if (nullptr != vertex_id_range)
  {
    if (vertex->m_id < vertex_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (vertex->m_id > vertex_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(vertex);

  if (vertex->m_edge_count < vertex->m_face_count)
  {
    if ( ON_SubDVertexTag::Corner != vertex->m_vertex_tag || vertex->m_edge_count < 3 )
      return ON_SubDIsNotValid(bSilentError);
  }

  if (vertex->m_edge_count > 0 && nullptr == vertex->m_edges)
    return ON_SubDIsNotValid(bSilentError);

  if (vertex->m_face_count > 0 && nullptr == vertex->m_faces)
    return ON_SubDIsNotValid(bSilentError);

  switch (vertex->m_vertex_tag)
  {
  case ON_SubDVertexTag::Smooth: // interior vertex
    if (vertex->m_edge_count != vertex->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Crease:
    if ( vertex->m_edge_count < 2 )
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Corner:
    if ( vertex->m_edge_count < 1 )
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Dart: // interior vertex
    if (level > 0 && ordinary_valence_count != vertex->m_edge_count)
      return ON_SubDIsNotValid(bSilentError);
    if (vertex->m_edge_count != vertex->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
    break;

  default:
    // invalid value for this enum
    return ON_SubDIsNotValid(bSilentError);
    break;
  }

  unsigned int count = vertex->m_edge_count;
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDEdge* edge = vertex->Edge(i);
    if (nullptr == edge)
      return ON_SubDIsNotValid(bSilentError);
  }

  count = vertex->m_face_count;
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDFace* face = vertex->Face(i);
    if (nullptr == face)
      return ON_SubDIsNotValid(bSilentError);
  }

  dm.ClearComponent();
  return true;
}